

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::FieldDescriptorProto::InternalSerializeWithCachedSizesToArray
          (FieldDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  FieldOptions *this_00;
  void *pvVar2;
  bool bVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  if ((uVar1 & 2) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(this->extendee_).ptr_,target);
  }
  if ((uVar1 & 0x40) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = this->number_;
    *target = '\x18';
    if ((ulong)(long)(int)uVar6 < 0x80) {
      target[1] = (byte)uVar6;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar6 | 0x80;
      uVar8 = (ulong)(long)(int)uVar6 >> 7;
      if (uVar6 < 0x4000) {
        target[2] = (uint8)uVar8;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar4 = target;
          puVar4[-1] = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          target = puVar4 + 1;
          bVar3 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar3);
        *puVar4 = (uint8)uVar9;
      }
    }
  }
  if ((uVar1 >> 8 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = this->label_;
    *target = ' ';
    if ((ulong)(long)(int)uVar6 < 0x80) {
      target[1] = (byte)uVar6;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar6 | 0x80;
      uVar8 = (ulong)(long)(int)uVar6 >> 7;
      if (uVar6 < 0x4000) {
        target[2] = (uint8)uVar8;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar4 = target;
          puVar4[-1] = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          target = puVar4 + 1;
          bVar3 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar3);
        *puVar4 = (uint8)uVar9;
      }
    }
  }
  if ((uVar1 >> 9 & 1) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = this->type_;
    *target = '(';
    if ((ulong)(long)(int)uVar6 < 0x80) {
      target[1] = (byte)uVar6;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar6 | 0x80;
      uVar8 = (ulong)(long)(int)uVar6 >> 7;
      if (uVar6 < 0x4000) {
        target[2] = (uint8)uVar8;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar4 = target;
          puVar4[-1] = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          target = puVar4 + 1;
          bVar3 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar3);
        *puVar4 = (uint8)uVar9;
      }
    }
  }
  if ((uVar1 & 4) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,6,(this->type_name_).ptr_,target);
  }
  if ((uVar1 & 8) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,7,(this->default_value_).ptr_,target);
  }
  if ((uVar1 & 0x20) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->options_;
    *target = 'B';
    uVar6 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar6 < 0x80) {
      target[1] = (byte)uVar6;
      puVar4 = target + 2;
    }
    else {
      target[1] = (byte)uVar6 | 0x80;
      if (uVar6 < 0x4000) {
        target[2] = (uint8)(uVar6 >> 7);
        puVar4 = target + 3;
      }
      else {
        puVar4 = target + 3;
        uVar6 = uVar6 >> 7;
        do {
          puVar5 = puVar4;
          puVar5[-1] = (byte)uVar6 | 0x80;
          uVar7 = uVar6 >> 7;
          puVar4 = puVar5 + 1;
          bVar3 = 0x3fff < uVar6;
          uVar6 = uVar7;
        } while (bVar3);
        *puVar5 = (uint8)uVar7;
      }
    }
    target = FieldOptions::InternalSerializeWithCachedSizesToArray(this_00,puVar4,stream);
  }
  if ((char)uVar1 < '\0') {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = this->oneof_index_;
    *target = 'H';
    if ((ulong)(long)(int)uVar6 < 0x80) {
      target[1] = (byte)uVar6;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar6 | 0x80;
      uVar8 = (ulong)(long)(int)uVar6 >> 7;
      if (uVar6 < 0x4000) {
        target[2] = (uint8)uVar8;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar4 = target;
          puVar4[-1] = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          target = puVar4 + 1;
          bVar3 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar3);
        *puVar4 = (uint8)uVar9;
      }
    }
  }
  if ((uVar1 & 0x10) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,10,(this->json_name_).ptr_,target);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    return target;
  }
  puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target,stream);
  return puVar4;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* FieldDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string extendee = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_extendee().data(), static_cast<int>(this->_internal_extendee().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.extendee");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_extendee(), target);
  }

  // optional int32 number = 3;
  if (cached_has_bits & 0x00000040u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_number(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if (cached_has_bits & 0x00000100u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      4, this->_internal_label(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if (cached_has_bits & 0x00000200u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      5, this->_internal_type(), target);
  }

  // optional string type_name = 6;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_type_name().data(), static_cast<int>(this->_internal_type_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.type_name");
    target = stream->WriteStringMaybeAliased(
        6, this->_internal_type_name(), target);
  }

  // optional string default_value = 7;
  if (cached_has_bits & 0x00000008u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_default_value().data(), static_cast<int>(this->_internal_default_value().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.default_value");
    target = stream->WriteStringMaybeAliased(
        7, this->_internal_default_value(), target);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if (cached_has_bits & 0x00000020u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        8, _Internal::options(this), target, stream);
  }

  // optional int32 oneof_index = 9;
  if (cached_has_bits & 0x00000080u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(9, this->_internal_oneof_index(), target);
  }

  // optional string json_name = 10;
  if (cached_has_bits & 0x00000010u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_json_name().data(), static_cast<int>(this->_internal_json_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.json_name");
    target = stream->WriteStringMaybeAliased(
        10, this->_internal_json_name(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldDescriptorProto)
  return target;
}